

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

config * Configtable_find(config *key)

{
  uint uVar1;
  int iVar2;
  config *in_RDI;
  x4node *np;
  int h;
  config *local_28;
  s_x4node *local_20;
  config *local_8;
  
  if (x4a == (s_x4 *)0x0) {
    local_8 = (config *)0x0;
  }
  else {
    uVar1 = confighash(in_RDI);
    local_20 = x4a->ht[(int)(uVar1 & x4a->size - 1U)];
    while ((local_20 != (s_x4node *)0x0 &&
           (iVar2 = Configcmp((char *)local_20->data,(char *)in_RDI), iVar2 != 0))) {
      local_20 = local_20->next;
    }
    if (local_20 == (s_x4node *)0x0) {
      local_28 = (config *)0x0;
    }
    else {
      local_28 = local_20->data;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

struct config *Configtable_find(struct config *key)
{
  int h;
  x4node *np;

  if( x4a==0 ) return 0;
  h = confighash(key) & (x4a->size-1);
  np = x4a->ht[h];
  while( np ){
    if( Configcmp((const char *) np->data,(const char *) key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}